

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::OnCallSpec<void_(int,_int,_double)>::Matches
          (OnCallSpec<void_(int,_int,_double)> *this,ArgumentTuple *args)

{
  bool bVar1;
  tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_> *in_RDI;
  tuple<int,_int,_double> *in_stack_00000008;
  MatcherBase<const_std::tuple<int,_int,_double>_&> *in_stack_00000010;
  tuple<int,_int,_double> *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<double>>,std::tuple<int,int,double>>
                    (in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    local_11 = MatcherBase<const_std::tuple<int,_int,_double>_&>::Matches
                         (in_stack_00000010,in_stack_00000008);
  }
  return local_11;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }